

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O3

void __thiscall TTD::EventLog::SetSnapshotOrInflateInProgress(EventLog *this,bool flag)

{
  List<Js::ScriptContext_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  ScriptContext **ppSVar1;
  int index;
  
  this_00 = ThreadContextTTD::GetTTDContexts(this->m_threadContext->TTDContext);
  if (0 < (this_00->super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>)
          .count) {
    index = 0;
    do {
      ppSVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&this_00->
                      super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,index);
      if ((*ppSVar1)->TTDSnapshotOrInflateInProgress == flag) {
        TTDAbort_unrecoverable_error("This is not re-entrant!!!");
      }
      ppSVar1 = JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::
                Item(&this_00->
                      super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     ,index);
      (*ppSVar1)->TTDSnapshotOrInflateInProgress = flag;
      index = index + 1;
    } while (index < (this_00->
                     super_ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>
                     ).count);
  }
  return;
}

Assistant:

void EventLog::SetSnapshotOrInflateInProgress(bool flag)
    {
        const JsUtil::List<Js::ScriptContext*, HeapAllocator>& contexts = this->m_threadContext->TTDContext->GetTTDContexts();
        for(int32 i = 0; i < contexts.Count(); ++i)
        {
            TTDAssert(contexts.Item(i)->TTDSnapshotOrInflateInProgress != flag, "This is not re-entrant!!!");

            contexts.Item(i)->TTDSnapshotOrInflateInProgress = flag;
        }
    }